

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objcomp.c
# Opt level: O1

void objclr(mcmcxdef *mctx,objnum objn,prpnum mindel)

{
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  uchar *puVar4;
  uint uVar5;
  prpnum *ppVar6;
  
  puVar4 = mcmlck(mctx,objn);
  uVar2 = *(ushort *)(puVar4 + 2);
  uVar3 = *(ushort *)(puVar4 + 6);
  uVar5 = (uint)uVar3;
  if (uVar3 != 0) {
    memmove(puVar4 + 0xe,puVar4 + (ulong)*(ushort *)(puVar4 + 4) * 2 + 0xe,
            (size_t)(puVar4 + ((ulong)*(ushort *)(puVar4 + 8) -
                              (long)(puVar4 + (ulong)*(ushort *)(puVar4 + 4) * 2 + 0xe))));
  }
  puVar4[4] = '\0';
  puVar4[5] = '\0';
  if (uVar3 != 0) {
    ppVar6 = (prpnum *)(puVar4 + 0xe);
    do {
      if (*ppVar6 < mindel) {
        ppVar6 = (prpnum *)((long)ppVar6 + (ulong)*(ushort *)((long)ppVar6 + 3) + 6);
      }
      else {
        *(byte *)((long)ppVar6 + 5) = *(byte *)((long)ppVar6 + 5) & 0xfd;
        objdelp(mctx,objn,*ppVar6,0);
      }
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  puVar1 = (ushort *)
           ((long)&mctx->mcmcxgl->mcmcxtab[mctx->mcmcxmtb[objn >> 8][objn & 0xff] >> 8]->mcmoflg +
           (ulong)((mctx->mcmcxmtb[objn >> 8][objn & 0xff] & 0xff) << 5));
  *puVar1 = *puVar1 | 1;
  mcmunlck(mctx,objn);
  if ((uVar2 & 2) == 0) {
    return;
  }
  objindx(mctx,objn);
  return;
}

Assistant:

void objclr(mcmcxdef *mctx, objnum objn, prpnum mindel)
{
    objdef *o;
    prpdef *p;
    int     cnt;
    prpnum  prop;
    int     indexed;
    
    /* get a lock on the object */
    o = (objdef *)mcmlck(mctx, objn);
    indexed = objflg(o) & OBJFINDEX;
    
    /* delete superclasses - move properties down over former sc array */
    if (objnprop(o))
        memmove(objsc(o), objprp(o),
                (size_t)(((uchar *)o) + objfree(o) - (uchar *)objprp(o)));
    objsnsc(o, 0);                                 /* zero superclasses now */
    
    /* delete non-"system" properties (propnum < mindel) */
    for (p = objprp(o), cnt = objnprop(o) ; cnt ; --cnt)
    {
        if ((prop = prpprop(p)) >= mindel)
        {
            prpflg(p) &= ~PRPFIGN;   /* delete even if it was marked ignore */
            objdelp(mctx, objn, prop, FALSE);  /* remove prpdef from object */
            /* p is left pointing at next prop, as it was moved down */
        }
        else
            p = objpnxt(p);                   /* advance over this property */
    }
    
    /* mark cache object modified and unlock it */
    mcmtch(mctx, objn);
    mcmunlck(mctx, objn);
    if (indexed) objindx(mctx, objn);
}